

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderManager.hpp
# Opt level: O2

void __thiscall
sjtu::OrderManager::refund_ticket
          (OrderManager *this,UserManager *user_manager,TrainManager *train_manager,int argc,
          string *argv)

{
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar1;
  FileManager<std::pair<sjtu::orderType,_long>_> *pFVar2;
  OrderManager *this_00;
  bool bVar3;
  int iVar4;
  orderType *order;
  orderType *order_00;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *key;
  ostream *poVar5;
  long lVar6;
  int i;
  ulong uVar7;
  allocator local_fa;
  allocator local_f9;
  OrderManager *local_f8;
  TrainManager *local_f0;
  pair<unsigned_long_long,_int> local_e8;
  vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> pendinglist;
  string uname;
  string local_a0;
  string local_80;
  string local_60;
  hashType local_40;
  undefined4 local_38;
  undefined4 extraout_var;
  
  uname._M_dataplus._M_p = (pointer)&uname.field_2;
  uname._M_string_length = 0;
  uname.field_2._M_local_buf[0] = '\0';
  iVar4 = 1;
  local_f8 = this;
  local_f0 = train_manager;
  for (lVar6 = 0; lVar6 < argc; lVar6 = lVar6 + 2) {
    bVar3 = std::operator==(argv,"-u");
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&uname);
    }
    else {
      bVar3 = std::operator==(argv,"-n");
      if (bVar3) {
        iVar4 = std::__cxx11::stoi(argv + 1,(size_t *)0x0,10);
      }
    }
    argv = argv + 2;
  }
  std::__cxx11::string::string((string *)&local_60,(string *)&uname);
  bVar3 = UserManager::is_login(user_manager,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar3) {
    order = (orderType *)operator_new(0xb8);
    order->date[1].month = 0;
    order->date[1].day = 0;
    order->date[1].hour = 0;
    order->date[1].minute = 0;
    order->date[0].month = 0;
    order->date[0].day = 0;
    order->date[0].hour = 0;
    order->date[0].minute = 0;
    strcpy((char *)order,uname._M_dataplus._M_p);
    bVar3 = UserManager::refund_order(user_manager,local_f8,iVar4,order);
    if (bVar3) {
      iVar4 = 0;
      if (order->status == success) {
        TrainManager::refund_ticket(local_f0,order);
        this_00 = local_f8;
        pBVar1 = local_f8->PendingBpTree;
        std::__cxx11::string::string((string *)&local_80,order->trainID,&local_f9);
        local_e8.first = StringHasher::operator()((StringHasher *)this_00,&local_80);
        local_e8.second = 0;
        std::__cxx11::string::string((string *)&local_a0,order->trainID,&local_fa);
        local_40 = StringHasher::operator()((StringHasher *)this_00,&local_a0);
        local_38 = 0x7fffffff;
        BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
        ::range_query((BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
                       *)&pendinglist,(pair<unsigned_long_long,_int> *)pBVar1,&local_e8);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_80);
        for (uVar7 = 0; uVar7 < (uint)pendinglist.currentLength; uVar7 = uVar7 + 1) {
          pFVar2 = this_00->OrderFile;
          local_e8.first = uVar7;
          vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::operator[]
                    (&pendinglist,&local_e8.first);
          iVar4 = (*(pFVar2->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                    _vptr_FileManager_Base[2])(pFVar2);
          order_00 = (orderType *)CONCAT44(extraout_var,iVar4);
          if (order_00->status != refunded) {
            bVar3 = TrainManager::buy_ticket(local_f0,order_00);
            if ((bVar3) && (order_00->status != pending)) {
              (*(this_00->OrderFile->super_FileManager_Base<std::pair<sjtu::orderType,_long>_>).
                _vptr_FileManager_Base[3])(this_00->OrderFile,&order_00->offset);
              pBVar1 = this_00->PendingBpTree;
              local_e8.first = uVar7;
              key = vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::operator[]
                              (&pendinglist,&local_e8.first);
              BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
              ::erase(pBVar1,&key->first);
            }
          }
        }
        operator_delete(pendinglist.data);
        iVar4 = 0;
      }
    }
    else {
      iVar4 = -1;
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::endl<char,std::char_traits<char>>(poVar5);
    operator_delete(order,0xb8);
  }
  else {
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::__cxx11::string::~string((string *)&uname);
  return;
}

Assistant:

void refund_ticket(UserManager *user_manager, TrainManager *train_manager, int argc, std::string *argv) {
            std::string uname;
            int number = 1;
            for (int i = 0; i < argc; i += 2) {
                if (argv[i] == "-u") uname = argv[i + 1];
                else if (argv[i] == "-n") number = stoi(argv[i + 1]);
            }
            if (user_manager->is_login(uname) == false) std::cout << -1 << std::endl;
            else {
                orderType *tmp = new orderType;
                strcpy(tmp->username, uname.c_str());
                if (user_manager->refund_order(this, number, tmp)) {
                    if (tmp -> status == success)
                    {
                        train_manager -> refund_ticket(tmp);
                        auto pendinglist = PendingBpTree -> range_query(
                                std::make_pair(hasher(tmp -> trainID) , 0) ,
                                std::make_pair(hasher(tmp -> trainID) , 0x7fffffff));
                        for (int i = 0 ; i < pendinglist . size() ; ++ i)
                        {
                            auto ret = OrderFile -> read(pendinglist[i] . second);
                            if (ret -> first . status != refunded && train_manager -> buy_ticket(&(ret -> first)))
                                if (ret -> first . status != pending)
                                {
                                    OrderFile -> save(ret -> first . offset);
                                    PendingBpTree -> erase(pendinglist[i] . first);
                                }
                        }
                    }
                    std::cout << 0 << std::endl;
                } else std::cout << -1 << std::endl;
                delete tmp;
            }
        }